

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O1

void __thiscall bgui::BaseWindow::showBuffer(BaseWindow *this)

{
  int iVar1;
  BaseWindowData *pBVar2;
  XFontStruct *pXVar3;
  int iVar4;
  XImage *pXVar5;
  GC p_Var6;
  int iVar7;
  Window WVar8;
  Display *pDVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->p->mutex);
  pBVar2 = this->p;
  if (pBVar2->running == true) {
    if ((pBVar2->text)._M_string_length == 0) {
      if ((pBVar2->info)._M_string_length == 0) {
        XPutImage(pBVar2->display,pBVar2->window,pBVar2->gc,pBVar2->image,0,0,0,0,pBVar2->w,
                  pBVar2->h);
      }
      else {
        uVar13 = XTextWidth(pBVar2->font,(pBVar2->info)._M_dataplus._M_p);
        pBVar2 = this->p;
        iVar16 = pBVar2->w;
        iVar4 = pBVar2->font->descent + pBVar2->font->ascent;
        iVar7 = (int)uVar13;
        if (pBVar2->top == true) {
          if (iVar16 - iVar7 != 0 && iVar7 <= iVar16) {
            if (pBVar2->left == true) {
              uVar10 = uVar13 & 0xffffffff;
            }
            else {
              uVar13 = 0;
              uVar10 = 0;
            }
            XPutImage(pBVar2->display,pBVar2->window,pBVar2->gc,pBVar2->image,uVar10,0,uVar13,0,
                      iVar16 - iVar7,iVar4);
          }
          pBVar2 = this->p;
          pDVar9 = pBVar2->display;
          WVar8 = pBVar2->window;
          p_Var6 = pBVar2->gc;
          pXVar5 = pBVar2->image;
          iVar16 = pBVar2->w;
          iVar7 = pBVar2->h - iVar4;
        }
        else {
          if (iVar16 - iVar7 != 0 && iVar7 <= iVar16) {
            iVar12 = pBVar2->h - iVar4;
            if (pBVar2->left == true) {
              uVar10 = uVar13 & 0xffffffff;
            }
            else {
              uVar10 = 0;
              uVar13 = 0;
            }
            XPutImage(pBVar2->display,pBVar2->window,pBVar2->gc,pBVar2->image,uVar10,iVar12,uVar13,
                      iVar12,iVar16 - iVar7,iVar4);
          }
          pBVar2 = this->p;
          pDVar9 = pBVar2->display;
          WVar8 = pBVar2->window;
          p_Var6 = pBVar2->gc;
          pXVar5 = pBVar2->image;
          iVar16 = pBVar2->w;
          iVar7 = pBVar2->h - iVar4;
          iVar4 = 0;
        }
        XPutImage(pDVar9,WVar8,p_Var6,pXVar5,0,iVar4,0,iVar4,iVar16,iVar7);
        anon_unknown_0::drawInfoText(this->p);
      }
    }
    else {
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar16 = 0;
      gutil::split((vector *)&list,(string *)&pBVar2->text,'\n',false);
      iVar7 = 0;
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar13 = 0;
        lVar15 = 8;
        iVar7 = 0;
        iVar16 = 0;
        do {
          if (*(long *)((long)&((list.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar15) != 0) {
            iVar4 = XTextWidth(this->p->font,
                               *(undefined8 *)
                                ((long)list.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8));
            if (iVar16 <= iVar4) {
              iVar16 = iVar4;
            }
          }
          pXVar3 = this->p->font;
          iVar7 = iVar7 + pXVar3->ascent + pXVar3->descent;
          uVar13 = uVar13 + 1;
          lVar15 = lVar15 + 0x20;
        } while (uVar13 < (ulong)((long)list.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)list.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      pBVar2 = this->p;
      iVar4 = pBVar2->w;
      iVar12 = 0;
      iVar14 = 0;
      if (iVar4 - iVar16 != 0 && iVar16 <= iVar4) {
        iVar14 = (iVar4 - iVar16) / 2;
      }
      iVar1 = pBVar2->h;
      if (iVar1 - iVar7 != 0 && iVar7 <= iVar1) {
        iVar12 = (iVar1 - iVar7) / 2;
      }
      if ((0 < iVar12) && (iVar11 = iVar12 + iVar7, iVar11 < iVar1)) {
        XPutImage(pBVar2->display,pBVar2->window,pBVar2->gc,pBVar2->image,0,0,0,0,iVar4,iVar12);
        pBVar2 = this->p;
        XPutImage(pBVar2->display,pBVar2->window,pBVar2->gc,pBVar2->image,0,iVar11,0,iVar11,
                  pBVar2->w,pBVar2->h - iVar11);
      }
      if (0 < iVar14) {
        pBVar2 = this->p;
        iVar16 = iVar16 + iVar14;
        if (iVar16 < pBVar2->w) {
          XPutImage(pBVar2->display,pBVar2->window,pBVar2->gc,pBVar2->image,0,iVar12,0,iVar12,iVar14
                    ,iVar7);
          pBVar2 = this->p;
          XPutImage(pBVar2->display,pBVar2->window,pBVar2->gc,pBVar2->image,iVar16,iVar12,iVar16,
                    iVar12,pBVar2->w - iVar16,iVar7);
        }
      }
      anon_unknown_0::drawInfoText(this->p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&list);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->p->mutex);
  return;
}

Assistant:

void BaseWindow::showBuffer()
{
  pthread_mutex_lock(&(p->mutex));

  if (p->running)
  {
    if (p->text.size() > 0)
    {
      // if text is displayed then draw whole image around text

      std::vector<std::string> list;
      gutil::split(list, p->text, '\n', false);

      int x=0, y=0;
      int w=0, h=0;

      for (size_t i=0; i<list.size(); i++)
      {
        if (list[i].size() > 0)
        {
          w=std::max(w, XTextWidth(p->font, list[i].c_str(), list[i].size()));
        }

        h+=p->font->ascent+p->font->descent;
      }

      if (p->w > w)
      {
        x+=(p->w-w)/2;
      }

      if (p->h > h)
      {
        y+=(p->h-h)/2;
      }

      if (y > 0 && p->h > y+h)
      {
        XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, y);
        XPutImage(p->display, p->window, p->gc, p->image, 0, y+h, 0, y+h, p->w, p->h-y-h);
      }

      if (x > 0 && p->w > x+w)
      {
        XPutImage(p->display, p->window, p->gc, p->image, 0, y, 0, y, x, h);
        XPutImage(p->display, p->window, p->gc, p->image, x+w, y, x+w, y, p->w-x-w, h);
      }

      // draw text

      drawInfoText(p);
    }
    else if (p->info.size() > 0)
    {
      // if info line is displayed then draw whole image except line

      int w=XTextWidth(p->font, p->info.c_str(), p->info.size());
      int h=p->font->ascent+p->font->descent;

      if (p->top)
      {
        if (p->w > w)
        {
          if (p->left)
          {
            XPutImage(p->display, p->window, p->gc, p->image, w, 0, w, 0, p->w-w, h);
          }
          else
          {
            XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w-w, h);
          }
        }

        XPutImage(p->display, p->window, p->gc, p->image, 0, h, 0, h, p->w, p->h-h);
      }
      else
      {
        if (p->w > w)
        {
          if (p->left)
          {
            XPutImage(p->display, p->window, p->gc, p->image, w, p->h-h, w, p->h-h, p->w-w, h);
          }
          else
          {
            XPutImage(p->display, p->window, p->gc, p->image, 0, p->h-h, 0, p->h-h, p->w-w, h);
          }
        }

        XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h-h);
      }

      // draw info line

      drawInfoText(p);
    }
    else
    {
      // draw whole image

      XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h);
    }
  }

  pthread_mutex_unlock(&(p->mutex));
}